

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::printInfo(FastText *this,real progress,real loss,ostream *log_stream)

{
  double dVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 in_XMM4_Qa;
  float fVar10;
  undefined8 in_XMM7_Qb;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  dVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lr;
  auVar5 = vpmovsxdq_avx(ZEXT816(0x278d0000000000));
  fVar10 = progress;
  if ((0.0 < progress) &&
     (dVar6 = (double)(lVar2 - (this->start_).__d.__r) / 1000000000.0, 0.0 <= dVar6)) {
    fVar10 = progress * 100.0;
    auVar9._0_8_ = (double)fVar10;
    auVar9._8_8_ = 0;
    auVar5._0_8_ = (double)(this->tokenCount_).super___atomic_base<long>._M_i / dVar6;
    auVar5._8_8_ = in_XMM4_Qa;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar6 * (double)(100.0 - fVar10);
    auVar5 = vunpcklpd_avx(auVar5,auVar7);
    auVar8._0_8_ = (double)((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           thread;
    auVar8._8_8_ = in_XMM7_Qb;
    auVar7 = vunpcklpd_avx(auVar8,auVar9);
    auVar5 = vdivpd_avx(auVar5,auVar7);
    auVar5 = vcvttpd2qq_avx512vl(auVar5);
  }
  lVar3 = vpextrq_avx(auVar5,1);
  *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) =
       *(uint *)(log_stream + *(long *)(*(long *)log_stream + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(log_stream,"Progress: ");
  lVar2 = *(long *)log_stream;
  *(undefined8 *)(log_stream + *(long *)(lVar2 + -0x18) + 8) = 1;
  *(undefined8 *)(log_stream + *(long *)(lVar2 + -0x18) + 0x10) = 5;
  poVar4 = (ostream *)std::ostream::operator<<(log_stream,fVar10);
  std::operator<<(poVar4,"%");
  poVar4 = std::operator<<(log_stream," words/sec/thread: ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 7;
  std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(log_stream," lr: ");
  lVar2 = *(long *)poVar4;
  *(undefined8 *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x10) = 9;
  *(undefined8 *)(poVar4 + *(long *)(lVar2 + -0x18) + 8) = 6;
  std::ostream::_M_insert<double>((1.0 - (double)progress) * dVar1);
  poVar4 = std::operator<<(log_stream," loss: ");
  lVar2 = *(long *)poVar4;
  *(undefined8 *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x10) = 9;
  *(undefined8 *)(poVar4 + *(long *)(lVar2 + -0x18) + 8) = 6;
  std::ostream::operator<<(poVar4,loss);
  poVar4 = std::operator<<(log_stream," ETA: ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 3;
  std::ostream::operator<<(poVar4,(int)(lVar3 / 0xe10));
  poVar4 = std::operator<<(log_stream,"h");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 2;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)(short)((short)(lVar3 % 0xe10) / 0x3c));
  std::operator<<(poVar4,"m");
  std::ostream::flush();
  return;
}

Assistant:

void FastText::printInfo(real progress, real loss, std::ostream& log_stream) {
  std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();
  double t = std::chrono::duration_cast<std::chrono::duration<double>> (end - start_).count();
  double lr = args_->lr * (1.0 - progress);
  double wst = 0;

  int64_t eta = 2592000; // Default to one month in seconds (720 * 3600)

  if (progress > 0 && t >= 0) {
    progress = progress * 100;
    eta = t * (100 - progress) / progress;
    wst = double(tokenCount_) / t / args_->thread;
  }
  int32_t etah = eta / 3600;
  int32_t etam = (eta % 3600) / 60;

  log_stream << std::fixed;
  log_stream << "Progress: ";
  log_stream << std::setprecision(1) << std::setw(5) << progress << "%";
  log_stream << " words/sec/thread: " << std::setw(7) << int64_t(wst);
  log_stream << " lr: " << std::setw(9) << std::setprecision(6) << lr;
  log_stream << " loss: " << std::setw(9) << std::setprecision(6) << loss;
  log_stream << " ETA: " << std::setw(3) << etah;
  log_stream << "h" << std::setw(2) << etam << "m";
  log_stream << std::flush;
}